

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes2ts.h
# Opt level: O3

void __thiscall
libwebm::VpxPes2Ts::VpxPes2Ts(VpxPes2Ts *this,string *input_file_name,string *output_file_name)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__VpxPes2Ts_00124b38;
  (this->input_file_name_)._M_dataplus._M_p = (pointer)&(this->input_file_name_).field_2;
  pcVar1 = (input_file_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->input_file_name_,pcVar1,pcVar1 + input_file_name->_M_string_length);
  (this->output_file_name_)._M_dataplus._M_p = (pointer)&(this->output_file_name_).field_2;
  pcVar1 = (output_file_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->output_file_name_,pcVar1,pcVar1 + output_file_name->_M_string_length);
  (this->ts_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ts_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->output_file_)._M_t.super___uniq_ptr_impl<_IO_FILE,_libwebm::FILEDeleter>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_libwebm::FILEDeleter>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (_IO_FILE *)0x0;
  (this->pes_converter_)._M_t.
  super___uniq_ptr_impl<libwebm::Webm2Pes,_std::default_delete<libwebm::Webm2Pes>_>._M_t.
  super__Tuple_impl<0UL,_libwebm::Webm2Pes_*,_std::default_delete<libwebm::Webm2Pes>_>.
  super__Head_base<0UL,_libwebm::Webm2Pes_*,_false>._M_head_impl = (Webm2Pes *)0x0;
  (this->ts_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

VpxPes2Ts(const std::string& input_file_name,
            const std::string& output_file_name)
      : input_file_name_(input_file_name),
        output_file_name_(output_file_name) {}